

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::BranchLayerParams::SharedDtor(BranchLayerParams *this)

{
  BranchLayerParams *pBVar1;
  BranchLayerParams *this_local;
  
  pBVar1 = internal_default_instance();
  if ((this != pBVar1) && (this->ifbranch_ != (NeuralNetwork *)0x0)) {
    (*(this->ifbranch_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pBVar1 = internal_default_instance();
  if ((this != pBVar1) && (this->elsebranch_ != (NeuralNetwork *)0x0)) {
    (*(this->elsebranch_->super_MessageLite)._vptr_MessageLite[1])();
  }
  return;
}

Assistant:

void BranchLayerParams::SharedDtor() {
  if (this != internal_default_instance()) {
    delete ifbranch_;
  }
  if (this != internal_default_instance()) {
    delete elsebranch_;
  }
}